

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

void __thiscall
wasm::DataFlow::Graph::mergeIf
          (Graph *this,Locals *aState,Locals *bState,Node *condition,Expression *expr,Locals *out)

{
  iterator iVar1;
  vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>> *this_00;
  Expression *local_70;
  Expression *expr_local;
  vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_> states
  ;
  Graph *local_40;
  Node *ifTrue;
  Node *ifFalse;
  
  local_70 = expr;
  local_40 = this;
  ifTrue = &this->bad;
  if (condition->type != Bad) {
    this_00 = (vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>> *)
              std::__detail::
              _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->expressionConditionMap,&local_70);
    local_40 = (Graph *)ensureI1(this,condition,(Expression *)0x0);
    iVar1._M_current = *(Node ***)(this_00 + 8);
    if (iVar1._M_current == *(Node ***)(this_00 + 0x10)) {
      std::vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>>::
      _M_realloc_insert<wasm::DataFlow::Node*const&>(this_00,iVar1,(Node **)&local_40);
    }
    else {
      *iVar1._M_current = (Node *)local_40;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
    ifTrue = makeZeroComp(this,condition,true,(Expression *)0x0);
    iVar1._M_current = *(Node ***)(this_00 + 8);
    if (iVar1._M_current == *(Node ***)(this_00 + 0x10)) {
      std::vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>>::
      _M_realloc_insert<wasm::DataFlow::Node*const&>(this_00,iVar1,&ifTrue);
    }
    else {
      *iVar1._M_current = ifTrue;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
  }
  expr_local = (Expression *)0x0;
  states.
  super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  states.
  super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((aState->super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (aState->super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<wasm::DataFlow::Graph::FlowState,std::allocator<wasm::DataFlow::Graph::FlowState>>::
    emplace_back<std::vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>>&,wasm::DataFlow::Node*&>
              ((vector<wasm::DataFlow::Graph::FlowState,std::allocator<wasm::DataFlow::Graph::FlowState>>
                *)&expr_local,aState,(Node **)&local_40);
  }
  if ((bState->super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (bState->super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<wasm::DataFlow::Graph::FlowState,std::allocator<wasm::DataFlow::Graph::FlowState>>::
    emplace_back<std::vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>>&,wasm::DataFlow::Node*&>
              ((vector<wasm::DataFlow::Graph::FlowState,std::allocator<wasm::DataFlow::Graph::FlowState>>
                *)&expr_local,bState,&ifTrue);
  }
  merge(this,(vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
              *)&expr_local,out);
  std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>::
  ~vector((vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
           *)&expr_local);
  return;
}

Assistant:

void mergeIf(Locals& aState,
               Locals& bState,
               Node* condition,
               Expression* expr,
               Locals& out) {
    // Create the conditions (if we can).
    Node* ifTrue;
    Node* ifFalse;
    if (!condition->isBad()) {
      // Generate boolean (i1 returning) conditions for the two branches.
      auto& conditions = expressionConditionMap[expr];
      ifTrue = ensureI1(condition, nullptr);
      conditions.push_back(ifTrue);
      ifFalse = makeZeroComp(condition, true, nullptr);
      conditions.push_back(ifFalse);
    } else {
      ifTrue = ifFalse = &bad;
    }
    // Finally, merge the state with that block. TODO optimize
    std::vector<FlowState> states;
    if (!isInUnreachable(aState)) {
      states.emplace_back(aState, ifTrue);
    }
    if (!isInUnreachable(bState)) {
      states.emplace_back(bState, ifFalse);
    }
    merge(states, out);
  }